

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::TeeBranch>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::TeeBranch> *this,void *pointer)

{
  long *plVar1;
  bool bVar2;
  Runnable local_20;
  void *local_18;
  
  if (pointer != (void *)0x0) {
    bVar2 = UnwindDetector::isUnwinding((UnwindDetector *)((long)pointer + 0x1c));
    if (bVar2) {
      local_20._vptr_Runnable = (_func_int **)&PTR_run_0044c168;
      local_18 = pointer;
      UnwindDetector::catchExceptionsAsSecondaryFaults
                ((UnwindDetector *)((long)pointer + 0x1c),&local_20);
    }
    else {
      RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1789:39)>
      ::anon_class_8_1_8991fb9c_for_func::operator()
                (*(anon_class_8_1_8991fb9c_for_func **)((long)pointer + 0x10));
    }
    plVar1 = *(long **)((long)pointer + 0x10);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x10) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 8))
                (*(undefined8 **)((long)pointer + 8),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
  }
  operator_delete(pointer,0x20);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }